

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avrogencpp.cc
# Opt level: O3

void __thiscall CodeGen::generateEnumTraits(CodeGen *this,NodePtr *n)

{
  long lVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ostream *poVar4;
  string fn;
  string last;
  string first;
  string dname;
  string local_b0;
  char *local_90;
  long local_88;
  char local_80;
  undefined7 uStack_7f;
  char *local_70;
  long local_68;
  char local_60;
  undefined7 uStack_5f;
  string local_50;
  
  iVar2 = (*n->px->_vptr_Node[3])();
  lVar1 = *(long *)(CONCAT44(extraout_var,iVar2) + 0x20);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,lVar1,*(long *)(CONCAT44(extraout_var,iVar2) + 0x28) + lVar1);
  fullname(&local_b0,this,&local_50);
  iVar2 = (*n->px->_vptr_Node[7])();
  local_68 = 0;
  local_60 = '\0';
  local_88 = 0;
  local_80 = '\0';
  local_90 = &local_80;
  local_70 = &local_60;
  if ((this->ns_)._M_string_length == 0) {
    (*n->px->_vptr_Node[8])(n->px,0);
    std::__cxx11::string::_M_assign((string *)&local_70);
    (*n->px->_vptr_Node[8])(n->px,(ulong)(iVar2 - 1));
    std::__cxx11::string::_M_assign((string *)&local_90);
  }
  else {
    std::__cxx11::string::_M_assign((string *)&local_70);
    std::__cxx11::string::append((char *)&local_70);
    iVar3 = (*n->px->_vptr_Node[8])(n->px,0);
    std::__cxx11::string::_M_append((char *)&local_70,*(ulong *)CONCAT44(extraout_var_00,iVar3));
    std::__cxx11::string::_M_assign((string *)&local_90);
    std::__cxx11::string::append((char *)&local_90);
    iVar2 = (*n->px->_vptr_Node[8])(n->px,(ulong)(iVar2 - 1));
    std::__cxx11::string::_M_append((char *)&local_90,*(ulong *)CONCAT44(extraout_var_01,iVar2));
  }
  poVar4 = this->os_;
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"template<> struct codec_traits<",0x1f);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,local_b0._M_dataplus._M_p,local_b0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"> {\n",4);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,"    static void encode(Encoder& e, ",0x23);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,local_b0._M_dataplus._M_p,local_b0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," v) {\n",6);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\t\tif (v < ",10);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_70,local_68);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," || v > ",8);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_90,local_88);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,")\n",2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\t\t{\n",4);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,"\t\t\tstd::ostringstream error;\n",0x1d);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,"\t\t\terror << \"enum value \" << v << \" is out of bound for ",0x38);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,local_b0._M_dataplus._M_p,local_b0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," and cannot be encoded\";\n",0x19);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,"\t\t\tthrow avro::Exception(error.str());\n",0x27);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\t\t}\n",4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"        e.encodeEnum(v);\n",0x19);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"    }\n",6);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,"    static void decode(Decoder& d, ",0x23);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,local_b0._M_dataplus._M_p,local_b0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"& v) {\n",7);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,"\t\tsize_t index = d.decodeEnum();\n",0x21);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\t\tif (index < ",0xe);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_70,local_68);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," || index > ",0xc);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_90,local_88);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,")\n",2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\t\t{\n",4);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,"\t\t\tstd::ostringstream error;\n",0x1d);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,"\t\t\terror << \"enum value \" << index << \" is out of bound for ",0x3c);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,local_b0._M_dataplus._M_p,local_b0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," and cannot be decoded\";\n",0x19);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,"\t\t\tthrow avro::Exception(error.str());\n",0x27);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\t\t}\n",4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"        v = static_cast<",0x18);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,local_b0._M_dataplus._M_p,local_b0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,">(index);\n",10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"    }\n",6);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"};\n\n",4);
  if (local_90 != &local_80) {
    operator_delete(local_90,CONCAT71(uStack_7f,local_80) + 1);
  }
  if (local_70 != &local_60) {
    operator_delete(local_70,CONCAT71(uStack_5f,local_60) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void CodeGen::generateEnumTraits(const NodePtr& n)
{
	string dname = decorate(n->name());
	string fn = fullname(dname);
	size_t c = n->names();
	string first; 
	string last;
	if (!ns_.empty())
	{
		first = ns_;
		first += "::";
		first += n->nameAt(0);

		last = ns_;
		last += "::";
		last += n->nameAt(c-1);
	} else {
		first = n->nameAt(0);
		last = n->nameAt(c-1);
	}
	os_ << "template<> struct codec_traits<" << fn << "> {\n"
		<< "    static void encode(Encoder& e, " << fn << " v) {\n"
		<< "		if (v < "  << first << " || v > " << last << ")\n" 
		<< "		{\n"
		<< "			std::ostringstream error;\n"
		<< "			error << \"enum value \" << v << \" is out of bound for " << fn << " and cannot be encoded\";\n"
		<< "			throw avro::Exception(error.str());\n"
		<< "		}\n"
		<< "        e.encodeEnum(v);\n"
		<< "    }\n"
		<< "    static void decode(Decoder& d, " << fn << "& v) {\n"
		<< "		size_t index = d.decodeEnum();\n"
		<< "		if (index < " << first << " || index > " << last << ")\n" 
		<< "		{\n"
		<< "			std::ostringstream error;\n"
		<< "			error << \"enum value \" << index << \" is out of bound for " << fn << " and cannot be decoded\";\n"
		<< "			throw avro::Exception(error.str());\n"
		<< "		}\n"
		<< "        v = static_cast<" << fn << ">(index);\n"
		<< "    }\n"
		<< "};\n\n";
}